

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BranchAndBound.cpp
# Opt level: O2

SearchStatus __thiscall tsbp::TwoStepBranchingProcedure::Solve(TwoStepBranchingProcedure *this)

{
  int iVar1;
  int iVar2;
  SearchStatus SVar3;
  long lVar4;
  long lVar5;
  pointer piVar6;
  double dVar7;
  allocator_type local_41;
  vector<int,_std::allocator<int>_> itemOrder;
  
  lVar4 = std::chrono::_V2::steady_clock::now();
  iVar1 = (this->parameters).TSBPThreads;
  std::vector<int,_std::allocator<int>_>::vector
            (&itemOrder,
             (long)(this->items).
                   super__Vector_base<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(this->items).
                   super__Vector_base<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_>._M_impl.
                   super__Vector_impl_data._M_start >> 5,&local_41);
  iVar2 = 0;
  for (piVar6 = itemOrder.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      piVar6 != itemOrder.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish; piVar6 = piVar6 + 1) {
    *piVar6 = iVar2;
    iVar2 = iVar2 + 1;
  }
  std::
  __sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_comp_iter<tsbp::CompareLexicographicDxDy>>
            ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             itemOrder.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             itemOrder.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_finish,(_Iter_comp_iter<tsbp::CompareLexicographicDxDy>)&this->items);
  std::vector<int,_std::allocator<int>_>::operator=(&this->branchingOrder,&itemOrder);
  if (iVar1 == 1) {
    SVar3 = SolveSequential(this);
    (this->statistics).NodeCountTSBP =
         ((long)(this->tree).super_type.m_vertices.
                super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                ._M_impl.super__Vector_impl_data._M_finish -
         (long)(this->tree).super_type.m_vertices.
               super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_tsbp::TwoStepBranchingProcedure::Node,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
               ._M_impl.super__Vector_impl_data._M_start) / 0x30;
  }
  else if (iVar1 < 1) {
    std::operator<<((ostream *)&std::cout,
                    "Invalid number of threads parameter, solve in sequential mode.\n");
    SVar3 = SolveSequential(this);
  }
  else {
    SVar3 = SolveParallelTaskflow(this);
  }
  lVar5 = std::chrono::_V2::steady_clock::now();
  dVar7 = (double)((lVar5 - lVar4) / 1000000);
  (this->statistics).TimeOverall = dVar7;
  (this->statistics).TimeTSBP = dVar7 - (this->statistics).TimeLMAO;
  dVar7 = MemoryUsedByCurrentProcess();
  (this->statistics).MemoryUsage = dVar7;
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&itemOrder.super__Vector_base<int,_std::allocator<int>_>);
  return SVar3;
}

Assistant:

SearchStatus TwoStepBranchingProcedure::Solve()
{
    auto start = std::chrono::steady_clock::now();

    SearchStatus searchStatus = SearchStatus::None;
    int numberOfThreads = this->parameters.TSBPThreads;

    std::vector<int> itemOrder(items.size());
    std::iota(itemOrder.begin(), itemOrder.end(), 0);
    std::sort(itemOrder.begin(), itemOrder.end(), CompareLexicographicDxDy(&items));

    this->branchingOrder = itemOrder;

    if (numberOfThreads == 1)
    {
        searchStatus = SolveSequential();
        this->statistics.NodeCountTSBP = this->tree.m_vertices.size();
    }
    else if (numberOfThreads >= 1)
    {
        searchStatus = SolveParallelTaskflow();
        ////searchStatus = SolveParallelNative();
    }
    else
    {
        std::cout << "Invalid number of threads parameter, solve in sequential mode.\n";
        searchStatus = SolveSequential();
    }

    auto end = std::chrono::steady_clock::now();
    auto time = std::chrono::duration_cast<std::chrono::milliseconds>(end - start).count();

    this->statistics.TimeOverall = time;
    this->statistics.TimeTSBP = time - this->statistics.TimeLMAO;
    this->statistics.MemoryUsage = MemoryUsedByCurrentProcess();

    return searchStatus;
}